

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O3

void av1_apply_active_map(AV1_COMP *cpi)

{
  segmentation *seg;
  
  seg = &(cpi->common).seg;
  if ((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
     ((cpi->rc).percent_blocks_inactive == 0)) {
    (cpi->active_map).enabled = 0;
    (cpi->active_map).update = 1;
  }
  else {
    if ((cpi->active_map).update == 0) {
      return;
    }
    if ((cpi->active_map).enabled != 0) {
      memcpy((cpi->enc_seg).map,(cpi->active_map).map,
             (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
      av1_enable_segmentation(seg);
      av1_enable_segfeature(seg,7,'\x06');
      av1_enable_segfeature(seg,7,'\x02');
      av1_enable_segfeature(seg,7,'\x01');
      av1_enable_segfeature(seg,7,'\x03');
      av1_enable_segfeature(seg,7,'\x04');
      av1_set_segdata(seg,7,'\x02',-0x3f);
      av1_set_segdata(seg,7,'\x01',-0x3f);
      av1_set_segdata(seg,7,'\x03',-0x3f);
      av1_set_segdata(seg,7,'\x04',-0x3f);
      goto LAB_001b8042;
    }
  }
  av1_disable_segfeature(seg,7,'\x06');
  av1_disable_segfeature(seg,7,'\x02');
  av1_disable_segfeature(seg,7,'\x01');
  av1_disable_segfeature(seg,7,'\x03');
  av1_disable_segfeature(seg,7,'\x04');
  if (seg->enabled != '\0') {
    (cpi->common).seg.update_map = '\x01';
    (cpi->common).seg.update_data = '\x01';
  }
LAB_001b8042:
  (cpi->active_map).update = 0;
  return;
}

Assistant:

void av1_apply_active_map(AV1_COMP *cpi) {
  struct segmentation *const seg = &cpi->common.seg;
  unsigned char *const seg_map = cpi->enc_seg.map;
  const unsigned char *const active_map = cpi->active_map.map;

  assert(AM_SEGMENT_ID_ACTIVE == CR_SEGMENT_ID_BASE);

  // Disable the active_maps on intra_only frames or if the
  // input map for the current frame has no inactive blocks.
  if (frame_is_intra_only(&cpi->common) ||
      cpi->rc.percent_blocks_inactive == 0) {
    cpi->active_map.enabled = 0;
    cpi->active_map.update = 1;
  }

  if (cpi->active_map.update) {
    if (cpi->active_map.enabled) {
      const int num_mis =
          cpi->common.mi_params.mi_rows * cpi->common.mi_params.mi_cols;
      memcpy(seg_map, active_map, sizeof(active_map[0]) * num_mis);
      av1_enable_segmentation(seg);
      av1_enable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_SKIP);
      av1_enable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_H);
      av1_enable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_V);
      av1_enable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_U);
      av1_enable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_V);

      av1_set_segdata(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_H,
                      -MAX_LOOP_FILTER);
      av1_set_segdata(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_V,
                      -MAX_LOOP_FILTER);
      av1_set_segdata(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_U,
                      -MAX_LOOP_FILTER);
      av1_set_segdata(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_V,
                      -MAX_LOOP_FILTER);
    } else {
      av1_disable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_SKIP);
      av1_disable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_H);
      av1_disable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_Y_V);
      av1_disable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_U);
      av1_disable_segfeature(seg, AM_SEGMENT_ID_INACTIVE, SEG_LVL_ALT_LF_V);
      if (seg->enabled) {
        seg->update_data = 1;
        seg->update_map = 1;
      }
    }
    cpi->active_map.update = 0;
  }
}